

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O2

QList<unsigned_long> * __thiscall
QOpenGLTimeMonitorPrivate::samples
          (QList<unsigned_long> *__return_storage_ptr__,QOpenGLTimeMonitorPrivate *this)

{
  GLuint GVar1;
  QOpenGLQueryHelper *pQVar2;
  pointer puVar3;
  long lVar4;
  int i;
  long lVar5;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->ext == (QExtTimerQueryHelper *)0x0) {
    lVar4 = 0;
    for (lVar5 = 0; lVar5 <= this->currentSample; lVar5 = lVar5 + 1) {
      pQVar2 = this->core;
      GVar1 = (this->timers).d.ptr[lVar5];
      puVar3 = QList<unsigned_long>::data(&this->timeSamples);
      (*pQVar2->GetQueryObjectui64v)(GVar1,0x8866,(GLuint64 *)((long)puVar3 + lVar4));
      lVar4 = lVar4 + 8;
    }
  }
  else {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QMessageLogger::warning
              (local_58,
               "QOpenGLTimeMonitor::samples() requires OpenGL >=3.3\nor OpenGL 3.2 and GL_ARB_timer_query"
              );
  }
  QArrayDataPointer<unsigned_long>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->timeSamples).d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<GLuint64> QOpenGLTimeMonitorPrivate::samples() const
{
    // For the Core and ARB options just ask for the timestamp for each timer query.
    // For the EXT implementation we cannot obtain timestamps so we defer any result
    // collection to the intervals() function
    if (!ext) {
        for (int i = 0; i <= currentSample; ++i)
            core->glGetQueryObjectui64v(timers.at(i), GL_QUERY_RESULT, &timeSamples[i]);
    } else {
        qWarning("QOpenGLTimeMonitor::samples() requires OpenGL >=3.3\n"
                 "or OpenGL 3.2 and GL_ARB_timer_query");
    }
    return timeSamples;
}